

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

QString * __thiscall QString::right(QString *__return_storage_ptr__,QString *this,qsizetype n)

{
  ulong uVar1;
  char16_t *pcVar2;
  
  uVar1 = (this->d).size;
  if ((ulong)n < uVar1) {
    pcVar2 = (this->d).ptr;
    if (pcVar2 == (char16_t *)0x0) {
      pcVar2 = L"";
    }
    QString(__return_storage_ptr__,(QChar *)(pcVar2 + (uVar1 - n)),n);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::right(qsizetype n) const
{
    if (size_t(n) >= size_t(size()))
        return *this;
    return QString(constData() + size() - n, n);
}